

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_exponentiation_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = 0;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar3 = yy_autoincrement_expr(G);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-2,0,"yySet");
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      do {
        iVar3 = G->pos;
        iVar5 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar5;
      iVar3 = yymatchString(G,"**");
      if (iVar3 == 0) break;
      do {
        iVar3 = G->pos;
        iVar5 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar5;
      iVar3 = yy_autoincrement_expr(G);
      if (iVar3 == 0) break;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_1_exponentiation_expr,G->begin,G->end,"yy_1_exponentiation_expr");
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyDo(G,yy_2_exponentiation_expr,G->begin,G->end,"yy_2_exponentiation_expr");
    yyDo(G,yyPop,2,0,"yyPop");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

YY_RULE(int) yy_exponentiation_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "exponentiation_expr"));
  if (!yy_autoincrement_expr(G))  goto l557;
  yyDo(G, yySet, -2, 0, "yySet");

  l558:;	
  {  int yypos559= G->pos, yythunkpos559= G->thunkpos;  if (!yy__(G))  goto l559;
  if (!yymatchString(G, "**")) goto l559;
  if (!yy__(G))  goto l559;
  if (!yy_autoincrement_expr(G))  goto l559;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_exponentiation_expr, G->begin, G->end, "yy_1_exponentiation_expr");
  goto l558;
  l559:;	  G->pos= yypos559; G->thunkpos= yythunkpos559;
  }  yyDo(G, yy_2_exponentiation_expr, G->begin, G->end, "yy_2_exponentiation_expr");
  yyprintf((stderr, "  ok   exponentiation_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l557:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "exponentiation_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}